

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall
WeightedReservoir_MergeReservoirs_Test::TestBody(WeightedReservoir_MergeReservoirs_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  float *__last;
  float fVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i_1;
  Float sumW;
  int64_t nTrials;
  atomic<int> count [8];
  int i;
  float weights [8];
  int n;
  RNG rng;
  uint64_t in_stack_fffffffffffffe88;
  RNG *in_stack_fffffffffffffe90;
  AssertionResult *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  char *in_stack_fffffffffffffea8;
  AssertionResult *this_01;
  Type in_stack_fffffffffffffebc;
  AssertionResult local_108;
  Message *in_stack_ffffffffffffff08;
  AssertHelper *in_stack_ffffffffffffff10;
  AssertionResult local_d8;
  int local_c4;
  undefined4 in_stack_ffffffffffffff44;
  double *in_stack_ffffffffffffff48;
  float *expr2;
  char *expr1;
  function<void_(long,_long)> *in_stack_ffffffffffffff70;
  int64_t in_stack_ffffffffffffff78;
  int64_t start;
  char local_78 [44];
  int local_4c;
  float local_48 [11];
  undefined4 local_1c;
  
  pbrt::RNG::RNG(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  local_1c = 8;
  for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
    fVar2 = pbrt::RNG::Uniform<float>(in_stack_fffffffffffffe90);
    local_48[local_4c] = fVar2 + 0.01;
  }
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0x18] = '\0';
  local_78[0x19] = '\0';
  local_78[0x1a] = '\0';
  local_78[0x1b] = '\0';
  local_78[0x1c] = '\0';
  local_78[0x1d] = '\0';
  local_78[0x1e] = '\0';
  local_78[0x1f] = '\0';
  start = 1000000;
  expr2 = local_48;
  expr1 = local_78;
  std::function<void(long,long)>::
  function<WeightedReservoir_MergeReservoirs_Test::TestBody()::__0,void>
            ((function<void_(long,_long)> *)
             CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
             (anon_class_16_2_1869d59d *)in_stack_fffffffffffffe98);
  pbrt::ParallelFor(start,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::function<void_(long,_long)>::~function((function<void_(long,_long)> *)0x6459ef);
  this_00 = (AssertHelper *)std::begin<float,8ul>((float (*) [8])local_48);
  __last = std::end<float,8ul>((float (*) [8])local_48);
  fVar2 = std::accumulate<float*,float>((float *)this_00,__last,0.0);
  for (local_c4 = 0; local_c4 < 8; local_c4 = local_c4 + 1) {
    std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_stack_fffffffffffffe98);
    this_01 = &local_d8;
    testing::internal::CmpHelperLE<double,float>
              (expr1,(char *)expr2,in_stack_ffffffffffffff48,
               (float *)CONCAT44(in_stack_ffffffffffffff44,fVar2));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
    in_stack_fffffffffffffebc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffebc);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffea8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x645b4e);
      testing::internal::AssertHelper::AssertHelper
                (this_00,in_stack_fffffffffffffebc,&this_01->success_,
                 (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
      testing::Message::~Message((Message *)0x645bab);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x645c03);
    std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_stack_fffffffffffffe98);
    in_stack_fffffffffffffe98 = &local_108;
    testing::internal::CmpHelperGE<double,float>
              (expr1,(char *)expr2,in_stack_ffffffffffffff48,
               (float *)CONCAT44(in_stack_ffffffffffffff44,fVar2));
    in_stack_fffffffffffffea7 =
         testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffe98);
    if (!(bool)in_stack_fffffffffffffea7) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffe90 =
           (RNG *)testing::AssertionResult::failure_message((AssertionResult *)0x645ce7);
      testing::internal::AssertHelper::AssertHelper
                (this_00,in_stack_fffffffffffffebc,&this_01->success_,
                 (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
      testing::Message::~Message((Message *)0x645d35);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x645d81);
  }
  return;
}

Assistant:

TEST(WeightedReservoir, MergeReservoirs) {
    RNG rng(6502);
    constexpr int n = 8;
    float weights[n];
    for (int i = 0; i < n; ++i)
        weights[i] = .01 + rng.Uniform<Float>();

    std::atomic<int> count[n] = {};
    int64_t nTrials = 1000000;
    ParallelFor(0, nTrials, [&](int64_t start, int64_t end) {
#ifdef PBRT_IS_MSVC
        // MSVC2019 doesn't seem to capture this as constexpr...
        constexpr int n = 8;
#endif
        int localCount[n] = {};

        for (int64_t i = start; i < end; ++i) {
            WeightedReservoirSampler<int> wrs0(i);
            WeightedReservoirSampler<int> wrs1(i + 1);

            for (int j = 0; j < n; ++j) {
                if (j & 1)
                    wrs0.Add(j, weights[j]);
                else
                    wrs1.Add(j, weights[j]);
            }

            wrs0.Merge(wrs1);
            ++localCount[wrs0.GetSample()];
        }

        for (int i = 0; i < n; ++i)
            count[i] += localCount[i];
    });

    Float sumW = std::accumulate(std::begin(weights), std::end(weights), Float(0));
    for (int i = 0; i < n; ++i) {
        EXPECT_LE(.98 * count[i] / double(nTrials), weights[i] / sumW);
        EXPECT_GE(1.02 * count[i] / double(nTrials), weights[i] / sumW);
    }
}